

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2LdStPre(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  void *Decoder_00;
  uint64_t extraout_RDX;
  uint64_t Address_00;
  uint64_t extraout_RDX_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint Op;
  uint RegNo;
  uint uVar4;
  
  RegNo = Insn >> 0xc & 0xf;
  uVar4 = Insn >> 0x10 & 0xf;
  if (uVar4 != 0xf) {
    if ((Insn >> 0x14 & 1) == 0) {
      DVar3 = DecodeGPRRegisterClass(Inst,uVar4,Address,Decoder);
      Address = extraout_RDX;
      if ((DVar3 | 2) != MCDisassembler_Success) {
        return MCDisassembler_Fail;
      }
    }
    else {
      DVar3 = MCDisassembler_Success;
    }
    DVar2 = DecodeGPRRegisterClass(Inst,RegNo,Address,Decoder);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar3 = MCDisassembler_SoftFail;
    }
    Address_01 = Address_00;
    if (((Insn >> 0x14 & 1) != 0) &&
       (DVar2 = DecodeGPRRegisterClass(Inst,uVar4,Address_00,Decoder), Address_01 = extraout_RDX_00,
       DVar2 != MCDisassembler_Success)) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar3 = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeT2AddrModeImm8
                      (Inst,uVar4 << 9 | Insn >> 1 & 0x100 | Insn & 0xff,Address_01,Decoder);
    if (DVar2 == MCDisassembler_Fail) {
      return MCDisassembler_Fail;
    }
    if (DVar2 == MCDisassembler_Success) {
      return DVar3;
    }
    if (DVar2 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    return MCDisassembler_SoftFail;
  }
  uVar1 = MCInst_getOpcode(Inst);
  uVar4 = uVar1 - 0x95a;
  Decoder_00 = (void *)(ulong)uVar4;
  if (uVar4 < 0x12) {
    if ((3U >> (uVar4 & 0x1f) & 1) != 0) {
      Op = 0x95e;
      if (RegNo == 0xf) {
        Op = 0x9b3;
      }
      goto LAB_00152168;
    }
    if ((0x300U >> (uVar4 & 0x1f) & 1) != 0) {
      Op = 0x966;
      goto LAB_00152168;
    }
    Op = 0x96e;
    if ((0x30000U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_00152168;
  }
  Decoder_00 = (void *)(ulong)(uVar1 - 0x952);
  if (uVar1 - 0x952 < 2) {
    Op = 0x956;
  }
  else {
    if (1 < uVar1 - 0x943) {
      return MCDisassembler_Fail;
    }
    Op = 0x947;
  }
LAB_00152168:
  MCInst_setOpcode(Inst,Op);
  DVar3 = DecodeT2LoadLabel(Inst,Insn,Address_02,Decoder_00);
  return DVar3;
}

Assistant:

static DecodeStatus DecodeT2LdStPre(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned load;
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned addr = fieldFromInstruction_4(Insn, 0, 8);
	addr |= fieldFromInstruction_4(Insn, 9, 1) << 8;
	addr |= Rn << 9;
	load = fieldFromInstruction_4(Insn, 20, 1);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDR_PRE:
			case ARM_t2LDR_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRB_PRE:
			case ARM_t2LDRB_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRH_PRE:
			case ARM_t2LDRH_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSB_PRE:
			case ARM_t2LDRSB_POST:
				if (Rt == 15)
					MCInst_setOpcode(Inst, ARM_t2PLIpci);
				else
					MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRSH_PRE:
			case ARM_t2LDRSH_POST:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (!load) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;

	if (load) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm8(Inst, addr, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}